

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algebraic-sensor.cpp
# Opt level: O3

void __thiscall
stateObservation::AlgebraicSensor::setState(AlgebraicSensor *this,Vector *state,TimeIndex k)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  double dVar4;
  int iVar5;
  int extraout_var;
  Index index_1;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  Index size;
  ActualDstType actualDst;
  ulong uVar6;
  
  uVar6 = this->concat_;
  pdVar2 = (state->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  if (-1 < (long)uVar6 || pdVar2 == (double *)0x0) {
    uVar8 = (state->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
            - uVar6;
    if (-1 < (long)(uVar8 | uVar6)) {
      if ((this->directInputToOutput_).
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows != uVar6)
      {
        if ((long)uVar6 < 0) {
          __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                        ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                        "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, 1>]"
                       );
        }
        Eigen::DenseStorage<double,_-1,_-1,_1,_0>::resize
                  ((DenseStorage<double,__1,__1,_1,_0> *)&this->directInputToOutput_,uVar6,uVar6,1);
        if ((this->directInputToOutput_).
            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows != uVar6
           ) goto LAB_0013f87c;
      }
      pdVar3 = (this->directInputToOutput_).
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
      uVar7 = uVar6 - ((long)uVar6 >> 0x3f) & 0xfffffffffffffffe;
      if (1 < (long)uVar6) {
        lVar9 = 0;
        do {
          dVar4 = (pdVar2 + uVar8 + lVar9)[1];
          pdVar1 = pdVar3 + lVar9;
          *pdVar1 = pdVar2[uVar8 + lVar9];
          pdVar1[1] = dVar4;
          lVar9 = lVar9 + 2;
        } while (lVar9 < (long)uVar7);
      }
      if ((long)uVar7 < (long)uVar6) {
        do {
          pdVar3[uVar7] = pdVar2[uVar8 + uVar7];
          uVar7 = uVar7 + 1;
        } while (uVar6 != uVar7);
      }
      iVar5 = (*(this->super_SensorBase)._vptr_SensorBase[0xe])(this);
      uVar6 = CONCAT44(extraout_var,iVar5);
      pdVar2 = (state->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
               m_data;
      if (extraout_var < 0 && pdVar2 != (double *)0x0) goto LAB_0013f83e;
      if ((-1 < extraout_var) &&
         ((long)uVar6 <=
          (state->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows))
      {
        if ((this->state_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_rows != uVar6) {
          Eigen::DenseStorage<double,_-1,_-1,_1,_0>::resize
                    ((DenseStorage<double,__1,__1,_1,_0> *)&this->state_,uVar6,uVar6,1);
          if ((this->state_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
              m_storage.m_rows != uVar6) {
LAB_0013f87c:
            __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                          "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,
                          "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Block<const Eigen::Matrix<double, -1, 1>, -1, 1>, T1 = double, T2 = double]"
                         );
          }
        }
        pdVar3 = (this->state_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                 m_storage.m_data;
        uVar8 = uVar6 & 0x7ffffffffffffffe;
        if (1 < uVar6) {
          uVar7 = 0;
          do {
            dVar4 = (pdVar2 + uVar7)[1];
            pdVar1 = pdVar3 + uVar7;
            *pdVar1 = pdVar2[uVar7];
            pdVar1[1] = dVar4;
            uVar7 = uVar7 + 2;
          } while (uVar7 < uVar8);
        }
        if ((long)uVar8 < (long)uVar6) {
          do {
            pdVar3[uVar8] = pdVar2[uVar8];
            uVar8 = uVar8 + 1;
          } while (uVar6 != uVar8);
        }
        this->storedNoisyMeasurement_ = false;
        this->storedNoiselessMeasurement_ = false;
        this->time_ = k;
        return;
      }
    }
    __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                  ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                  "Eigen::Block<const Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                 );
  }
LAB_0013f83e:
  __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                "Eigen::MapBase<Eigen::Block<const Eigen::Matrix<double, -1, 1>, -1, 1>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<const Eigen::Matrix<double, -1, 1>, -1, 1>, Level = 0]"
               );
}

Assistant:

void AlgebraicSensor::setState(const Vector & state, TimeIndex k)
{
  directInputToOutput_ = state.tail(concat_);
  state_ = state.head(getStateSize_());
  storedNoisyMeasurement_ = false;
  storedNoiselessMeasurement_ = false;

  time_ = k;
}